

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_drawinfo.cpp
# Opt level: O0

void __thiscall GLDrawList::DoDrawSorted(GLDrawList *this,SortNode *head)

{
  GLDrawItem *pGVar1;
  GLFlat *pGVar2;
  int *local_30;
  SortNode *ehead;
  float z;
  int relation;
  float clipsplit [2];
  SortNode *head_local;
  GLDrawList *this_local;
  
  ehead._4_4_ = 0;
  ehead._0_4_ = 0.0;
  clipsplit = (float  [2])head;
  FRenderState::GetClipSplit(&gl_RenderState,&z);
  pGVar1 = TArray<GLDrawItem,_GLDrawItem>::operator[](&this->drawitems,(long)*(int *)clipsplit);
  if (pGVar1->rendertype == GLDIT_FLAT) {
    pGVar1 = TArray<GLDrawItem,_GLDrawItem>::operator[](&this->drawitems,(long)*(int *)clipsplit);
    pGVar2 = TArray<GLFlat,_GLFlat>::operator[](&this->flats,(long)pGVar1->index);
    ehead._0_4_ = pGVar2->z;
    ehead._4_4_ = -1;
    if (ViewPos.Z < (double)ehead._0_4_) {
      ehead._4_4_ = 1;
    }
  }
  if (*(long *)((long)clipsplit + 0x18) != 0) {
    if (ehead._4_4_ == -1) {
      FRenderState::SetClipSplit(&gl_RenderState,z,ehead._0_4_);
    }
    else if (ehead._4_4_ == 1) {
      FRenderState::SetClipSplit(&gl_RenderState,ehead._0_4_,(float)relation);
    }
    DoDrawSorted(this,*(SortNode **)((long)clipsplit + 0x18));
    FRenderState::SetClipSplit(&gl_RenderState,&z);
  }
  DoDraw(this,4,*(int *)clipsplit,true);
  if (*(long *)((long)clipsplit + 0x20) != 0) {
    for (local_30 = *(int **)((long)clipsplit + 0x20); local_30 != (int *)0x0;
        local_30 = *(int **)(local_30 + 8)) {
      DoDraw(this,4,*local_30,true);
    }
  }
  if (*(long *)((long)clipsplit + 0x28) != 0) {
    if (ehead._4_4_ == 1) {
      FRenderState::SetClipSplit(&gl_RenderState,z,ehead._0_4_);
    }
    else if (ehead._4_4_ == -1) {
      FRenderState::SetClipSplit(&gl_RenderState,ehead._0_4_,(float)relation);
    }
    DoDrawSorted(this,*(SortNode **)((long)clipsplit + 0x28));
    FRenderState::SetClipSplit(&gl_RenderState,&z);
  }
  return;
}

Assistant:

void GLDrawList::DoDrawSorted(SortNode * head)
{
	float clipsplit[2];
	int relation = 0;
	float z = 0.f;

	gl_RenderState.GetClipSplit(clipsplit);

	if (drawitems[head->itemindex].rendertype == GLDIT_FLAT)
	{
		z = flats[drawitems[head->itemindex].index].z;
		relation = z > ViewPos.Z ? 1 : -1;
	}


	// left is further away, i.e. for stuff above viewz its z coordinate higher, for stuff below viewz its z coordinate is lower
	if (head->left) 
	{
		if (relation == -1)
		{
			gl_RenderState.SetClipSplit(clipsplit[0], z);	// render below: set flat as top clip plane
		}
		else if (relation == 1)
		{
			gl_RenderState.SetClipSplit(z, clipsplit[1]);	// render above: set flat as bottom clip plane
		}
		DoDrawSorted(head->left);
		gl_RenderState.SetClipSplit(clipsplit);
	}
	DoDraw(GLPASS_TRANSLUCENT, head->itemindex, true);
	if (head->equal)
	{
		SortNode * ehead=head->equal;
		while (ehead)
		{
			DoDraw(GLPASS_TRANSLUCENT, ehead->itemindex, true);
			ehead=ehead->equal;
		}
	}
	// right is closer, i.e. for stuff above viewz its z coordinate is lower, for stuff below viewz its z coordinate is higher
	if (head->right)
	{
		if (relation == 1)
		{
			gl_RenderState.SetClipSplit(clipsplit[0], z);	// render below: set flat as top clip plane
		}
		else if (relation == -1)
		{
			gl_RenderState.SetClipSplit(z, clipsplit[1]);	// render above: set flat as bottom clip plane
		}
		DoDrawSorted(head->right);
		gl_RenderState.SetClipSplit(clipsplit);
	}
}